

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O0

void bonk_dsp(t_bonk *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  t_insig *local_30;
  t_insig *gp;
  int ninsig;
  int n;
  int i;
  t_signal **sp_local;
  t_bonk *x_local;
  
  iVar1 = (*sp)->s_n;
  iVar2 = x->x_ninsig;
  x->x_sr = (*sp)->s_sr;
  ninsig = 0;
  local_30 = x->x_insig;
  _n = sp;
  for (; ninsig < iVar2; ninsig = ninsig + 1) {
    local_30->g_invec = (*_n)->s_vec;
    local_30 = local_30 + 1;
    _n = _n + 1;
  }
  dsp_add(bonk_perform,2,x,(long)iVar1);
  return;
}

Assistant:

static void bonk_dsp(t_bonk *x, t_signal **sp)
{
    int i, n = sp[0]->s_n, ninsig = x->x_ninsig;
    t_insig *gp;
    
    x->x_sr = sp[0]->s_sr;
    
    for (i = 0, gp = x->x_insig; i < ninsig; i++, gp++)
        gp->g_invec = (*(sp++))->s_vec;
    
    dsp_add(bonk_perform, 2, x, (t_int)n);
}